

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

value * __thiscall cppcms::json::value::operator[](value *this,size_t n)

{
  array *paVar1;
  bad_value_cast *pbVar2;
  allocator local_39;
  string local_38;
  
  if ((((this->d).d.ptr_)->value_).type != is_array) {
    pbVar2 = (bad_value_cast *)__cxa_allocate_exception(0x48);
    std::__cxx11::string::string((string *)&local_38,"",&local_39);
    bad_value_cast::bad_value_cast(pbVar2,&local_38,(((this->d).d.ptr_)->value_).type,is_array);
    __cxa_throw(pbVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
  }
  paVar1 = array(this);
  if (n < (ulong)((long)(paVar1->
                        super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(paVar1->
                        super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3)) {
    paVar1 = array(this);
    return (paVar1->super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>).
           _M_impl.super__Vector_impl_data._M_start + n;
  }
  pbVar2 = (bad_value_cast *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_38,"Index out of range",&local_39);
  bad_value_cast::bad_value_cast(pbVar2,&local_38);
  __cxa_throw(pbVar2,&bad_value_cast::typeinfo,bad_value_cast::~bad_value_cast);
}

Assistant:

value const &value::operator[](size_t n) const
	{
		if(type()!=json::is_array)
			throw bad_value_cast("",type(),json::is_array);
		if(n >= array().size())
			throw bad_value_cast("Index out of range");
		return array()[n];
	}